

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O2

void spell_lesser_golem(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  byte *pbVar1;
  undefined2 uVar2;
  bool bVar3;
  int charges;
  int iVar4;
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA *ch_00;
  short sVar5;
  char *txt;
  int iVar6;
  CHAR_DATA **ch_01;
  float local_12a8;
  float local_12a4;
  AFFECT_DATA af;
  char type [4608];
  
  target_name = one_argument(target_name,type);
  charges = atoi(target_name);
  bVar3 = str_cmp(type,"");
  if (bVar3) {
    bVar3 = str_cmp(type,"blood");
    if (((bVar3) && (bVar3 = str_cmp(type,"bone"), bVar3)) && (bVar3 = str_cmp(type,"flesh"), bVar3)
       ) {
      txt = 
      "That is not an acceptable golem type.\n\rSyntax:  cast \'lesser golem\' <bone/blood/flesh> <ounces of blood>\n\r"
      ;
    }
    else if (charges == 0) {
      txt = 
      "You must use at least one ounce of blood.\n\rSyntax:  cast \'lesser golem\' <bone/blood/flesh> <ounces of blood>\n\r"
      ;
    }
    else if (charges < 0x15) {
      bVar3 = is_affected(ch,(int)gsn_lesser_golem);
      if (bVar3) {
        txt = "You cannot create another lesser golem so soon.\n\r";
      }
      else {
        ch_01 = &char_list;
        do {
          ch_01 = &((CHAR_DATA *)ch_01)->next->next;
          if ((CHAR_DATA *)ch_01 == (CHAR_DATA *)0x0) {
            bVar3 = drain_urn(ch,charges);
            if (!bVar3) {
              return;
            }
            bVar3 = str_cmp(type,"blood");
            local_12a8 = 1.0;
            if (!bVar3) {
              local_12a8 = 1.5;
            }
            iVar6 = 0xb8d;
            if (bVar3) {
              iVar6 = 0;
            }
            bVar3 = str_cmp(type,"bone");
            local_12a4 = 1.0;
            if (!bVar3) {
              local_12a4 = 3.0;
              local_12a8 = 0.5;
            }
            iVar4 = 0xb8c;
            if (bVar3) {
              iVar4 = iVar6;
            }
            bVar3 = str_cmp(type,"flesh");
            if (!bVar3) {
              local_12a4 = 2.0;
              local_12a8 = 1.0;
            }
            iVar6 = 0xb8b;
            if (bVar3) {
              iVar6 = iVar4;
            }
            init_affect(&af);
            af.where = 0;
            af.aftype = 7;
            af.location = 0;
            af.modifier = 0;
            iVar4 = dice(5,8);
            af.duration = (short)iVar4;
            af.type = (short)sn;
            af.level = ch->level;
            affect_to_char(ch,&af);
            pMobIndex = get_mob_index(iVar6);
            ch_00 = create_mobile(pMobIndex);
            sVar5 = (short)(int)((float)(int)ch->max_hit * local_12a4);
            ch_00->max_hit = sVar5;
            ch_00->hit = (int)sVar5;
            ch_00->damroll = 0;
            sVar5 = (short)(charges / 2) + ch->level + -10;
            ch_00->level = sVar5;
            ch_00->damage[1] = 2;
            ch_00->damage[0] = sVar5;
            ch_00->damage[2] = (short)(int)((float)charges * local_12a8) + sVar5 / 3;
            add_follower(ch_00,ch);
            ch_00->leader = ch;
            pbVar1 = (byte *)((long)ch_00->affected_by + 2);
            *pbVar1 = *pbVar1 | 4;
            char_to_room(ch_00,ch->in_room);
            act("$n pours some blood on the floor.  It begins shifting and changing, finally forming $N!"
                ,ch,(void *)0x0,ch_00,0);
            act("You pour some blood on the floor.  It begins shifting and changing, finally forming $N!"
                ,ch,(void *)0x0,ch_00,3);
            return;
          }
          bVar3 = is_npc((CHAR_DATA *)ch_01);
        } while (((!bVar3) || (((CHAR_DATA *)ch_01)->master != ch)) ||
                (uVar2 = ((CHAR_DATA *)ch_01)->pIndexData->vnum, 2 < (ushort)(uVar2 - 0xb8b)));
        txt = "You already have a golem under your command.\n\r";
      }
    }
    else {
      txt = "You cannot use more than twenty ounces of blood at once.\n\r";
    }
  }
  else {
    txt = "Syntax:  cast \'lesser golem\' <bone/blood/flesh> <ounces of blood>\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_lesser_golem(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *mob;
	int vnum = 0;
	float armorMultiplier = 1;
	float dmgMultiplier = 1;
	char type[MSL];
	int num;
	CHAR_DATA *check;
	AFFECT_DATA af;

	target_name = one_argument(target_name, type);
	num = atoi(target_name);

	if (!str_cmp(type, ""))
	{
		send_to_char("Syntax:  cast 'lesser golem' <bone/blood/flesh> <ounces of blood>\n\r", ch);
		return;
	}

	if (str_cmp(type, "blood") && str_cmp(type, "bone") && str_cmp(type, "flesh"))
	{
		send_to_char("That is not an acceptable golem type.\n\r" \
					"Syntax:  cast 'lesser golem' <bone/blood/flesh> <ounces of blood>\n\r", ch);
		return;
	}

	if (num == 0)
	{
		send_to_char("You must use at least one ounce of blood.\n\r" \
					"Syntax:  cast 'lesser golem' <bone/blood/flesh> <ounces of blood>\n\r", ch);
		return;
	}

	if (num > 20)
	{
		send_to_char("You cannot use more than twenty ounces of blood at once.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_lesser_golem))
	{
		send_to_char("You cannot create another lesser golem so soon.\n\r", ch);
		return;
	}

	for (check = char_list; check != nullptr; check = check->next)
	{
		if (is_npc(check)
			&& check->master == ch
			&& (check->pIndexData->vnum == 2955 || check->pIndexData->vnum == 2956 || check->pIndexData->vnum == 2957))
		{
			send_to_char("You already have a golem under your command.\n\r", ch);
			return;
		}
	}

	
	if (!drain_urn(ch, num))
		return;

	if (!str_cmp(type, "blood"))
	{
		vnum = 2957;
		armorMultiplier = 1;
		dmgMultiplier = 1.5;
	}

	if (!str_cmp(type, "bone"))
	{
		vnum = 2956;
		armorMultiplier = 3;
		dmgMultiplier = 0.5;
	}

	if (!str_cmp(type, "flesh"))
	{
		vnum = 2955;
		armorMultiplier =  2;
		dmgMultiplier = 1;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.location = 0;
	af.modifier = 0;
	af.duration = dice(5, 8);
	af.type = sn;
	af.level = ch->level;
	affect_to_char(ch, &af);

	mob = create_mobile(get_mob_index(vnum));
	mob->max_hit = (short)(ch->max_hit * armorMultiplier);
	mob->hit = mob->max_hit;
	mob->damroll = 0;
	mob->level = ch->level - 10 + (num / 2);
	mob->damage[DICE_TYPE] = 2;
	mob->damage[DICE_NUMBER] = mob->level;
	mob->damage[DICE_BONUS] = (mob->level / 3) + (int)(num * dmgMultiplier);

	add_follower(mob, ch);

	mob->leader = ch;

	SET_BIT(mob->affected_by, AFF_CHARM);

	char_to_room(mob, ch->in_room);

	act("$n pours some blood on the floor.  It begins shifting and changing, finally forming $N!", ch, 0, mob, TO_ROOM);
	act("You pour some blood on the floor.  It begins shifting and changing, finally forming $N!", ch, 0, mob, TO_CHAR);
}